

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O2

YSRESULT __thiscall YsSoundPlayer::SoundData::Resample(SoundData *this,int newRate)

{
  ulong uVar1;
  int atTimeStep;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t ch;
  long lVar9;
  ulong uVar10;
  uchar *savePtr;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  uchar *local_d0;
  uchar *local_a8;
  
  if (this->rate != newRate) {
    bVar12 = this->stereo == YSTRUE;
    uVar11 = (ulong)(this->bit >> 3);
    uVar8 = uVar11 << bVar12;
    local_a8 = (uchar *)0x0;
    uVar1 = (ulong)this->sizeInBytes / (uVar8 & 0xffffffff);
    uVar5 = ((long)newRate * uVar1) / (ulong)this->rate;
    uVar6 = uVar5 * uVar8;
    if (uVar6 != 0) {
      local_a8 = (uchar *)operator_new__(uVar6);
      auVar17._8_4_ = (int)(uVar5 >> 0x20);
      auVar17._0_8_ = uVar5;
      auVar17._12_4_ = 0x45300000;
      local_d0 = local_a8;
      for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
        auVar19._8_4_ = (int)(uVar7 >> 0x20);
        auVar19._0_8_ = uVar7;
        auVar19._12_4_ = 0x45300000;
        dVar13 = (((auVar19._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * (double)uVar1) /
                 ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
        uVar10 = (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13;
        dVar13 = fmod(dVar13,1.0);
        atTimeStep = (int)uVar10;
        savePtr = local_d0;
        for (lVar9 = 0; (ulong)bVar12 + 1 != lVar9; lVar9 = lVar9 + 1) {
          iVar4 = (int)lVar9;
          if (uVar10 < uVar1 - 1) {
            if (uVar10 < uVar1 - 2 && uVar10 != 0) {
              iVar2 = GetSignedValueRaw(this,iVar4,atTimeStep + -1);
              iVar3 = GetSignedValueRaw(this,iVar4,atTimeStep);
              dVar14 = (double)iVar3;
              iVar3 = GetSignedValueRaw(this,iVar4,atTimeStep + 1);
              dVar15 = (double)iVar3;
              iVar4 = GetSignedValueRaw(this,iVar4,atTimeStep + 2);
              dVar18 = ((double)(iVar2 + iVar3) - (dVar14 + dVar14)) * 0.5;
              dVar16 = ((((double)iVar4 - (dVar15 + dVar15)) - (dVar18 + dVar18)) + dVar14) / 6.0;
              dVar14 = (((dVar15 - dVar16) - dVar18) - dVar14) * dVar13 +
                       dVar16 * dVar13 * dVar13 * dVar13 + dVar18 * dVar13 * dVar13 + dVar14;
            }
            else {
              iVar2 = GetSignedValueRaw(this,iVar4,atTimeStep);
              iVar4 = GetSignedValueRaw(this,iVar4,atTimeStep + 1);
              dVar14 = (double)iVar4 * dVar13 + (double)iVar2 * (1.0 - dVar13);
            }
            iVar4 = (int)dVar14;
          }
          else {
            iVar4 = GetSignedValueRaw(this,iVar4,(int)(uVar1 - 1));
          }
          SetSignedValueRaw(this,savePtr,iVar4);
          savePtr = savePtr + uVar11;
        }
        local_d0 = local_d0 + uVar8;
      }
    }
    this->rate = newRate;
    if (this->dat != (uchar *)0x0) {
      operator_delete__(this->dat);
    }
    this->dat = local_a8;
    this->sizeInBytes = (uint)uVar6;
  }
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::Resample(int newRate)
{
	if(rate!=newRate)
	{
		const size_t nChannel=(YSTRUE==stereo ? 2 : 1);
		const size_t bytePerSample=bit/8;
		const size_t bytePerTimeStep=nChannel*bytePerSample;
		const size_t curNTimeStep=sizeInBytes/bytePerTimeStep;

		const size_t newNTimeStep=curNTimeStep*newRate/rate;
		const size_t newSize=newNTimeStep*bytePerTimeStep;

		unsigned char *newDat=(0<newSize ? new unsigned char [newSize] : NULL);
		if(NULL!=newDat)
		{
			for(size_t ts=0; ts<newNTimeStep; ts++)
			{
				double oldTimeStepD=(double)curNTimeStep*(double)ts/(double)newNTimeStep;
				size_t oldTimeStep=(size_t)oldTimeStepD;
				double param=fmod(oldTimeStepD,1.0);
				unsigned char *newTimeStepPtr=newDat+ts*bytePerTimeStep;

				for(size_t ch=0; ch<nChannel; ++ch)
				{
					if(curNTimeStep-1<=oldTimeStep)
					{
						const int value=GetSignedValueRaw(ch,curNTimeStep-1);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,value);
					}
					else if(0==oldTimeStep || curNTimeStep-2<=oldTimeStep)
					{
						const double value[2]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep),
								(double)GetSignedValueRaw(ch,oldTimeStep+1)
							};
						const int newValue=(int)(value[0]*(1.0-param)+value[1]*param);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,newValue);
					}
					else
					{
						const double v[4]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep-1),  // At x=-1.0
								(double)GetSignedValueRaw(ch,oldTimeStep),    // At x= 0.0
								(double)GetSignedValueRaw(ch,oldTimeStep+1),  // At x= 1.0
								(double)GetSignedValueRaw(ch,oldTimeStep+2)   // At x= 2.0
							};

						// Cubic interpolation.  Linear didn't work well.
						// axxx+bxx+cx+d=e
						// x=-1  -> -a+b-c+d=v0   (A)
						// x= 0  ->        d=v1   (B)
						// x= 1  ->  a+b+c+d=v2   (C)
						// x= 2  -> 8a+4b+2c+d=v3 (D)
						//
						// (B) =>  d=v1;
						// (A)+(C) => 2b+2d=v0+v2  => b=(v0+v2-2d)/2
						//
						// (D)-2*(B) =>  6a+2b-d=v3-2*v2
						//           =>  a=(v3-2*v2-2b+d)/6

						const double d=v[1];
						const double b=(v[0]+v[2]-2.0*d)/2.0;
						const double a=(v[3]-2.0*v[2]-2.0*b+d)/6.0;
						const double c=v[2]-a-b-d;

						double newValue=a*param*param*param
							+b*param*param
							+c*param
							+d;
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,(int)newValue);
					}
				}
			}
		}

		rate=newRate;
		delete [] dat;
		dat=newDat;
		sizeInBytes=newSize;
	}
	return YSOK;
}